

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::SlotI2
          (ByteCodeWriter *this,OpCode op,RegSlot value,uint32 slotId1,uint32 slotId2)

{
  code *pcVar1;
  bool bVar2;
  RegSlot value_00;
  undefined4 *puVar3;
  uint32 slotId1_00;
  uint32 local_40;
  uint32 local_3c;
  RegSlot local_38;
  uint32 local_34;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x3f);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  local_34 = slotId1;
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x6c4,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_008a0153;
    *puVar3 = 0;
  }
  if (value != 0xffffffff) {
    if (this->m_functionWrite == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_008a0153;
      *puVar3 = 0;
    }
    slotId1_00 = local_34;
    value_00 = FunctionBody::MapRegSlot(this->m_functionWrite,value);
    if (((0x11 < op - 0x140) || ((0x3a119U >> (op - 0x140 & 0x1f) & 1) == 0)) && (1 < op - 0x94)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x6db,"(false)",
                                  "The specified OpCode is not intended for slot access");
      if (!bVar2) goto LAB_008a0153;
      *puVar3 = 0;
      slotId1_00 = local_34;
    }
    bVar2 = TryWriteElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,op,value_00,slotId1_00,slotId2);
    if (!bVar2) {
      bVar2 = TryWriteElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                        (this,op,value_00,slotId1_00,slotId2);
      if (!bVar2) {
        local_40 = slotId1_00;
        local_3c = slotId2;
        local_38 = value_00;
        Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,op,this);
        Data::Write(&this->m_byteCodeData,&local_40,0xc);
      }
    }
    return;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar3 = 0;
    Throw::InternalError();
  }
LAB_008a0153:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::SlotI2(OpCode op, RegSlot value, uint32 slotId1, uint32 slotId2)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementSlotI2);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);

#if DBG
        switch (op)
        {
            case OpCode::StInnerSlot:
            case OpCode::StInnerSlotChkUndecl:
            case OpCode::StInnerObjSlot:
            case OpCode::StInnerObjSlotChkUndecl:
            case OpCode::StEnvSlot:
            case OpCode::StEnvSlotChkUndecl:
            case OpCode::StEnvObjSlot:
            case OpCode::StEnvObjSlotChkUndecl:
            case OpCode::StModuleSlot:
            case OpCode::LdModuleSlot:
            {
                break;
            }

            default:
            {
                AssertMsg(false, "The specified OpCode is not intended for slot access");
                break;
            }
        }
#endif

        MULTISIZE_LAYOUT_WRITE(ElementSlotI2, op, value, slotId1, slotId2);
    }